

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerTextureCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerTextureCase *this,int measurementNdx
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConditionalUsage CVar2;
  ConditionalType CVar3;
  int iVar4;
  deUint32 cacheAvoidanceID;
  float fVar5;
  deUint32 id;
  ConditionalType in_R8D;
  Vec4 local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  local_168;
  Vector<float,_16> local_148;
  string local_108;
  string nameSpec;
  UniformSpec local_c0;
  Vec4 local_58;
  Vec4 local_48;
  
  cacheAvoidanceID =
       ShaderCompilerCase::getSpecializationID(&this->super_ShaderCompilerCase,measurementNdx);
  getNameSpecialization_abi_cxx11_(&nameSpec,(Performance *)(ulong)cacheAvoidanceID,id);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  textureLookupVertexTemplate_abi_cxx11_
            ((string *)&local_148,(Performance *)(ulong)this->m_conditionalUsage,
             this->m_conditionalType,(ConditionalType)paVar1);
  specializeShaderSource(&local_c0.name,(string *)&local_148,cacheAvoidanceID,SHADER_VALIDITY_VALID)
  ;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_148);
  textureLookupFragmentTemplate_abi_cxx11_
            ((string *)&local_148,(Performance *)(ulong)(uint)this->m_numLookups,
             this->m_conditionalUsage,this->m_conditionalType,in_R8D);
  specializeShaderSource(&local_c0.name,(string *)&local_148,cacheAvoidanceID,SHADER_VALIDITY_VALID)
  ;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_148);
  CVar2 = this->m_conditionalUsage;
  CVar3 = this->m_conditionalType;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity = 0;
  std::operator+(&local_188,"a_position",&nameSpec);
  local_168.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_168.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_198.m_data[0] = -1.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 0.0;
  local_198.m_data[3] = 1.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = -1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 1.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  combineVec4ToVec16(&local_148,(Vec4 *)&local_168,&local_198,&local_48,&local_58);
  ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_c0,&local_188,&local_148);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)&local_108,(AttribSpec *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_188);
  std::operator+(&local_188,"a_coords",&nameSpec);
  local_168.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.m_data[0] = 0.0;
  local_198.m_data[1] = 1.0;
  local_198.m_data[2] = 0.0;
  local_198.m_data[3] = 0.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  local_58.m_data[0] = 1.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 0.0;
  combineVec4ToVec16(&local_148,(Vec4 *)&local_168,&local_198,&local_48,&local_58);
  ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_c0,&local_188,&local_148);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)&local_108,(AttribSpec *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_188);
  if ((CVar2 != CONDITIONAL_USAGE_NONE) && (CVar3 == CONDITIONAL_TYPE_DYNAMIC)) {
    std::operator+(&local_188,"a_condition",&nameSpec);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_168,1.0);
    tcu::Vector<float,_4>::Vector(&local_198,1.0);
    tcu::Vector<float,_4>::Vector(&local_48,1.0);
    tcu::Vector<float,_4>::Vector(&local_58,1.0);
    combineVec4ToVec16(&local_148,(Vec4 *)&local_168,&local_198,&local_48,&local_58);
    ShaderCompilerCase::AttribSpec::AttribSpec((AttribSpec *)&local_c0,&local_188,&local_148);
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
              ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                *)&local_108,(AttribSpec *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_188);
  }
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::_M_move_assign(&__return_storage_ptr__->vertexAttributes,&local_108);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&local_108);
  iVar4 = this->m_numLookups;
  CVar2 = this->m_conditionalUsage;
  CVar3 = this->m_conditionalType;
  local_168.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar5 = 0.0;
  while (local_198.m_data[0] = fVar5, (int)fVar5 < iVar4) {
    de::toString<int>(&local_108,(int *)&local_198);
    std::operator+(&local_188,"u_sampler",&local_108);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
                   &local_188,&nameSpec);
    ShaderCompilerCase::UniformSpec::UniformSpec
              (&local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
               TYPE_TEXTURE_UNIT,(float)(int)local_198.m_data[0]);
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>(&local_168,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_108);
    fVar5 = (float)((int)local_198.m_data[0] + 1);
  }
  if ((CVar2 != CONDITIONAL_USAGE_NONE) && (CVar3 == CONDITIONAL_TYPE_UNIFORM)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
                   "u_condition",&nameSpec);
    ShaderCompilerCase::UniformSpec::UniformSpec(&local_c0,(string *)&local_148,TYPE_FLOAT,1.0);
    std::
    vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
    ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>(&local_168,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_148);
  }
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::_M_move_assign(&__return_storage_ptr__->uniforms,&local_168);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_168);
  std::__cxx11::string::~string((string *)&nameSpec);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerTextureCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(textureLookupVertexTemplate(m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(textureLookupFragmentTemplate(m_numLookups, m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.vertexAttributes		= textureLookupShaderAttributes(nameSpec, m_conditionalUsage, m_conditionalType);
	result.uniforms				= textureLookupShaderUniforms(nameSpec, m_numLookups, m_conditionalUsage, m_conditionalType);

	return result;
}